

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int BIO_up_ref(BIO *a)

{
  int iVar1;
  long in_RDI;
  int i;
  int local_14 [4];
  uint local_4;
  
  iVar1 = CRYPTO_UP_REF((int *)(in_RDI + 0x58),local_14,*(void **)(in_RDI + 0x80));
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    local_4 = (uint)(1 < local_14[0]);
  }
  return local_4;
}

Assistant:

int BIO_up_ref(BIO *a)
{
    int i;

    if (CRYPTO_UP_REF(&a->references, &i, a->lock) <= 0)
        return 0;

    REF_PRINT_COUNT("BIO", a);
    REF_ASSERT_ISNT(i < 2);
    return i > 1;
}